

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::Matcher::ResetLoopInfos(Matcher *this)

{
  Program *pPVar1;
  LoopInfo **ppLVar2;
  int local_14;
  int i;
  Matcher *this_local;
  
  local_14 = 0;
  while( true ) {
    pPVar1 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
    if (pPVar1->numLoops <= local_14) break;
    ppLVar2 = Memory::WriteBarrierPtr::operator_cast_to_LoopInfo__
                        ((WriteBarrierPtr *)&this->loopInfos);
    LoopInfo::Reset(*ppLVar2 + local_14);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Matcher::ResetLoopInfos()
    {
        for (int i = 0; i < program->numLoops; i++)
        {
            loopInfos[i].Reset();
        }
    }